

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  iterator __first;
  iterator __last;
  size_type sVar4;
  reference pvVar5;
  reference ppVar6;
  char *pcVar7;
  bool local_349;
  undefined1 local_2d0 [4];
  int plevel;
  string parallel;
  undefined1 local_290 [8];
  ostringstream cmCTestLog_msg;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  *handler;
  iterator __end2;
  iterator __begin2;
  t_TestingHandlers *__range2;
  string input;
  string targ;
  string arg;
  undefined1 local_88 [8];
  string errormsg;
  size_t i;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  const_iterator local_40;
  bool local_33;
  byte local_32;
  byte local_31;
  bool SRArgumentSpecified;
  bool executeTests;
  char *pcStack_30;
  bool cmakeAndTest;
  char *ctestExec;
  string *output_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTest *this_local;
  
  pcStack_30 = "ctest";
  local_31 = 0;
  local_32 = 1;
  local_33 = false;
  ctestExec = (char *)output;
  output_local = (string *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->InitialCommandLineArguments);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_40,&local_48);
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)output_local);
  __last = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)output_local);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->InitialCommandLineArguments,local_40,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__last._M_current);
  errormsg.field_2._8_8_ = 1;
  do {
    uVar1 = errormsg.field_2._8_8_;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)output_local);
    if (sVar4 <= (ulong)uVar1) {
      if ((this->ParallelLevelSetInCli & 1U) == 0) {
        std::__cxx11::string::string((string *)local_2d0);
        bVar2 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL",(string *)local_2d0);
        if (bVar2) {
          pcVar7 = (char *)std::__cxx11::string::c_str();
          iVar3 = atoi(pcVar7);
          SetParallelLevel(this,iVar3);
        }
        std::__cxx11::string::~string((string *)local_2d0);
      }
      local_349 = false;
      if (((this->TestProgressOutput & 1U) != 0) &&
         (local_349 = false, this->OutputLogFile == (cmGeneratedFileStream *)0x0)) {
        local_349 = ProgressOutputSupportedByConsole();
      }
      this->TestProgressOutput = local_349;
      if ((local_31 & 1) == 0) {
        if ((local_32 & 1) == 0) {
          this_local._4_4_ = 1;
        }
        else {
          this_local._4_4_ = ExecuteTests(this);
        }
      }
      else {
        this_local._4_4_ = RunCMakeAndTest(this,(string *)ctestExec);
      }
      return this_local._4_4_;
    }
    std::__cxx11::string::string((string *)local_88);
    bVar2 = HandleCommandLineArguments
                      (this,(size_t *)(errormsg.field_2._M_local_buf + 8),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)output_local,(string *)local_88);
    if (bVar2) {
      HandleScriptArguments
                (this,(size_t *)(errormsg.field_2._M_local_buf + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)output_local,&local_33);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)output_local,errormsg.field_2._8_8_);
      std::__cxx11::string::string((string *)(targ.field_2._M_local_buf + 8),(string *)pvVar5);
      bVar2 = CheckArgument(this,(string *)((long)&targ.field_2 + 8),"-D","--dashboard");
      uVar1 = errormsg.field_2._8_8_;
      if ((bVar2) &&
         (sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local), (ulong)uVar1 < sVar4 - 1)) {
        this->ProduceXML = true;
        errormsg.field_2._8_8_ = errormsg.field_2._8_8_ + 1;
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)output_local,errormsg.field_2._8_8_);
        std::__cxx11::string::string((string *)(input.field_2._M_local_buf + 8),(string *)pvVar5);
        bVar2 = AddTestsForDashboardType(this,(string *)((long)&input.field_2 + 8));
        if ((!bVar2) &&
           (bVar2 = AddVariableDefinition(this,(string *)((long)&input.field_2 + 8)), !bVar2)) {
          ErrorMessageUnknownDashDValue(this,(string *)((long)&input.field_2 + 8));
          local_32 = 0;
        }
        std::__cxx11::string::~string((string *)(input.field_2._M_local_buf + 8));
      }
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&targ.field_2 + 8),"-D");
      if (bVar2) {
        pcVar7 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::SystemTools::StringStartsWith(pcVar7,"-D");
        if (bVar2) {
          std::__cxx11::string::substr((ulong)&__range2,(ulong)((long)&targ.field_2 + 8));
          AddVariableDefinition(this,(string *)&__range2);
          std::__cxx11::string::~string((string *)&__range2);
        }
      }
      bVar2 = HandleTestActionArgument
                        (this,pcStack_30,(size_t *)(errormsg.field_2._M_local_buf + 8),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local);
      if (!bVar2) {
        local_32 = 0;
      }
      bVar2 = HandleTestModelArgument
                        (this,pcStack_30,(size_t *)(errormsg.field_2._M_local_buf + 8),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local);
      if (!bVar2) {
        local_32 = 0;
      }
      bVar2 = CheckArgument(this,(string *)((long)&targ.field_2 + 8),"--extra-submit",(char *)0x0);
      uVar1 = errormsg.field_2._8_8_;
      if ((bVar2) &&
         (sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)output_local), (ulong)uVar1 < sVar4 - 1)) {
        this->ProduceXML = true;
        SetTest(this,"Submit",true);
        errormsg.field_2._8_8_ = errormsg.field_2._8_8_ + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)output_local,errormsg.field_2._8_8_);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        bVar2 = SubmitExtraFiles(this,pcVar7);
        if (bVar2) goto LAB_00153f6b;
        this_local._4_4_ = 0;
        bVar2 = true;
      }
      else {
LAB_00153f6b:
        bVar2 = CheckArgument(this,(string *)((long)&targ.field_2 + 8),"--build-and-test",
                              (char *)0x0);
        uVar1 = errormsg.field_2._8_8_;
        if ((bVar2) &&
           (sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)output_local), (ulong)uVar1 < sVar4 - 1)) {
          local_31 = 1;
        }
        bVar2 = CheckArgument(this,(string *)((long)&targ.field_2 + 8),"--schedule-random",
                              (char *)0x0);
        if (bVar2) {
          std::__cxx11::string::operator=((string *)&this->ScheduleType,"Random");
        }
        __end2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                 ::begin(&this->TestingHandlers);
        handler = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
                   *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                     ::end(&this->TestingHandlers);
        while (bVar2 = std::operator!=(&__end2,(_Self *)&handler), bVar2) {
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
                   ::operator*(&__end2);
          iVar3 = (*ppVar6->second->_vptr_cmCTestGenericHandler[2])
                            (ppVar6->second,(undefined1 *)((long)&targ.field_2 + 8),
                             (undefined1 *)((long)&errormsg.field_2 + 8),output_local);
          if (iVar3 == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
            std::operator<<((ostream *)local_290,
                            "Problem parsing command line arguments within a handler");
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            Log(this,7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx"
                ,0x8c6,pcVar7,false);
            std::__cxx11::string::~string((string *)(parallel.field_2._M_local_buf + 8));
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
            this_local._4_4_ = 0;
            bVar2 = true;
            goto LAB_001541ab;
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
          ::operator++(&__end2);
        }
        bVar2 = false;
      }
LAB_001541ab:
      std::__cxx11::string::~string((string *)(targ.field_2._M_local_buf + 8));
    }
    else {
      cmSystemTools::Error((string *)local_88);
      this_local._4_4_ = 1;
      bVar2 = true;
    }
    std::__cxx11::string::~string((string *)local_88);
    if (bVar2) {
      return this_local._4_4_;
    }
    errormsg.field_2._8_8_ = errormsg.field_2._8_8_ + 1;
  } while( true );
}

Assistant:

int cmCTest::Run(std::vector<std::string>& args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  this->InitialCommandLineArguments.insert(
    this->InitialCommandLineArguments.end(), args.begin(), args.end());

  // process the command line arguments
  for (size_t i = 1; i < args.size(); ++i) {
    // handle the simple commandline arguments
    std::string errormsg;
    if (!this->HandleCommandLineArguments(i, args, errormsg)) {
      cmSystemTools::Error(errormsg);
      return 1;
    }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i, args, SRArgumentSpecified);

    // --dashboard: handle a request for a dashboard
    std::string arg = args[i];
    if (this->CheckArgument(arg, "-D", "--dashboard") && i < args.size() - 1) {
      this->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ)) {
        if (!this->AddVariableDefinition(targ)) {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
        }
      }
    }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if (arg != "-D" && cmSystemTools::StringStartsWith(arg.c_str(), "-D")) {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
    }

    // --test-action: calls SetTest(<stage>, /*report=*/ false) to enable
    // the corresponding stage
    if (!this->HandleTestActionArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --test-model: what type of test model
    if (!this->HandleTestModelArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --extra-submit
    if (this->CheckArgument(arg, "--extra-submit") && i < args.size() - 1) {
      this->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if (!this->SubmitExtraFiles(args[i].c_str())) {
        return 0;
      }
    }

    // --build-and-test options
    if (this->CheckArgument(arg, "--build-and-test") && i < args.size() - 1) {
      cmakeAndTest = true;
    }

    // --schedule-random
    if (this->CheckArgument(arg, "--schedule-random")) {
      this->ScheduleType = "Random";
    }

    // pass the argument to all the handlers as well, but i may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    for (auto& handler : this->TestingHandlers) {
      if (!handler.second->ProcessCommandLineArguments(arg, i, args)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem parsing command line arguments within a handler");
        return 0;
      }
    }
  } // the close of the for argument loop

  // handle CTEST_PARALLEL_LEVEL environment variable
  if (!this->ParallelLevelSetInCli) {
    std::string parallel;
    if (cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL", parallel)) {
      int plevel = atoi(parallel.c_str());
      this->SetParallelLevel(plevel);
    }
  }

  // TestProgressOutput only supported if console supports it and not logging
  // to a file
  this->TestProgressOutput = this->TestProgressOutput &&
    !this->OutputLogFile && this->ProgressOutputSupportedByConsole();
#ifdef _WIN32
  if (this->TestProgressOutput) {
    // Disable output line buffering so we can print content without
    // a newline.
    std::setvbuf(stdout, nullptr, _IONBF, 0);
  }
#endif

  // now what should cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if (cmakeAndTest) {
    return this->RunCMakeAndTest(output);
  }

  if (executeTests) {
    return this->ExecuteTests();
  }

  return 1;
}